

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O0

uint64_t __thiscall boomphf::bitVector::build_ranks(bitVector *this,uint64_t offset)

{
  uint uVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  size_t ii;
  uint64_t curent_rank;
  ulong x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)curent_rank,ii);
  this_00 = in_RSI;
  for (x = 0; x < *(ulong *)(in_RDI + 0x10); x = x + 1) {
    if ((x & 7) == 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (this_00,(value_type *)in_RSI);
    }
    uVar1 = popcount_64(x);
    in_RSI = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             ((long)&(in_RSI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start + (ulong)uVar1);
  }
  return (uint64_t)in_RSI;
}

Assistant:

uint64_t build_ranks(uint64_t offset =0)
		{
			_ranks.reserve(2+ _size/_nb_bits_per_rank_sample);

			uint64_t curent_rank = offset;
			for (size_t ii = 0; ii < _nchar; ii++) {
				if (((ii*64)  % _nb_bits_per_rank_sample) == 0) {
					_ranks.push_back(curent_rank);
				}
				curent_rank +=  popcount_64(_bitArray[ii]);
			}

			return curent_rank;
		}